

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O0

void S_ParseSndInfo(bool redefine)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int local_10;
  int lump;
  bool redefine_local;
  
  if (!redefine) {
    TArray<FSavedPlayerSoundInfo,_FSavedPlayerSoundInfo>::Clear(&SavedPlayerSounds);
  }
  addterm(S_ClearSoundData,"S_ClearSoundData");
  S_ClearSoundData();
  CurrentPitchMask = '\0';
  S_AddSound("{ no sound }","DSEMPTY",(FScanner *)0x0);
  for (local_10 = 0; iVar2 = FWadCollection::GetNumLumps(&Wads), local_10 < iVar2;
      local_10 = local_10 + 1) {
    iVar2 = FWadCollection::GetLumpNamespace(&Wads,local_10);
    if (iVar2 == 0) {
      bVar1 = FWadCollection::CheckLumpName(&Wads,local_10,"SNDINFO");
      if (bVar1) {
        S_AddSNDINFO(local_10);
      }
    }
    else if (iVar2 == 7) {
      S_AddBloodSFX(local_10);
    }
    else if (iVar2 == 9) {
      S_AddStrifeVoice(local_10);
    }
  }
  S_RestorePlayerSounds();
  S_HashSounds();
  TArray<sfxinfo_t,_sfxinfo_t>::ShrinkToFit(&S_sfx);
  uVar3 = TArray<FRandomSoundList,_FRandomSoundList>::Size(&S_rnd);
  if (uVar3 != 0) {
    TArray<FRandomSoundList,_FRandomSoundList>::ShrinkToFit(&S_rnd);
  }
  S_ShrinkPlayerSoundLists();
  sfx_empty = FWadCollection::CheckNumForName(&Wads,"dsempty",0xd);
  return;
}

Assistant:

void S_ParseSndInfo (bool redefine)
{
	int lump;

	if (!redefine) SavedPlayerSounds.Clear();	// clear skin sounds only for initial parsing.
	atterm (S_ClearSoundData);
	S_ClearSoundData();	// remove old sound data first!

	CurrentPitchMask = 0;
	S_AddSound ("{ no sound }", "DSEMPTY");	// Sound 0 is no sound at all
	for (lump = 0; lump < Wads.GetNumLumps(); ++lump)
	{
		switch (Wads.GetLumpNamespace (lump))
		{
		case ns_global:
			if (Wads.CheckLumpName (lump, "SNDINFO"))
			{
				S_AddSNDINFO (lump);
			}
			break;

		case ns_bloodsfx:
			S_AddBloodSFX (lump);
			break;

		case ns_strifevoices:
			S_AddStrifeVoice (lump);
			break;
		}
	}
	S_RestorePlayerSounds();
	S_HashSounds ();
	S_sfx.ShrinkToFit ();

	if (S_rnd.Size() > 0)
	{
		S_rnd.ShrinkToFit ();
	}

	S_ShrinkPlayerSoundLists ();

	sfx_empty = Wads.CheckNumForName ("dsempty", ns_sounds);
}